

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::remap_swizzle
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *out_type,
          uint32_t input_components,string *expr)

{
  uint index;
  CompilerGLSL *this_00;
  char (*in_R9) [2];
  uint32_t c;
  uint uVar1;
  
  if (out_type->vecsize == input_components) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr);
  }
  else if ((input_components == 1) && ((this->backend).can_swizzle_scalar == false)) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])
              ((spirv_cross *)&stack0xffffffffffffffb0,this,out_type,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&stack0xffffffffffffffb0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
               (char (*) [2])expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,in_R9);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  else {
    enclose_expression((string *)&stack0xffffffffffffffb0,this,expr);
    ::std::operator+(__return_storage_ptr__,(string *)&stack0xffffffffffffffb0,".");
    this_00 = (CompilerGLSL *)&stack0xffffffffffffffb0;
    ::std::__cxx11::string::~string((string *)this_00);
    for (uVar1 = 0; uVar1 < out_type->vecsize; uVar1 = uVar1 + 1) {
      index = uVar1;
      if (input_components - 1 < uVar1) {
        index = input_components - 1;
      }
      index_to_swizzle(this_00,index);
      this_00 = (CompilerGLSL *)__return_storage_ptr__;
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((1 < out_type->vecsize) && ((this->backend).swizzle_is_function != false)) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    remove_duplicate_swizzle(this,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::remap_swizzle(const SPIRType &out_type, uint32_t input_components, const string &expr)
{
	if (out_type.vecsize == input_components)
		return expr;
	else if (input_components == 1 && !backend.can_swizzle_scalar)
		return join(type_to_glsl(out_type), "(", expr, ")");
	else
	{
		// FIXME: This will not work with packed expressions.
		auto e = enclose_expression(expr) + ".";
		// Just clamp the swizzle index if we have more outputs than inputs.
		for (uint32_t c = 0; c < out_type.vecsize; c++)
			e += index_to_swizzle(min(c, input_components - 1));
		if (backend.swizzle_is_function && out_type.vecsize > 1)
			e += "()";

		remove_duplicate_swizzle(e);
		return e;
	}
}